

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O2

bool __thiscall
HookStateStepIn::Start(HookStateStepIn *this,shared_ptr<Debugger> *debugger,lua_State *current)

{
  bool bVar1;
  int iVar2;
  lua_Debug ar;
  __shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> _Stack_488;
  lua_Debug local_478;
  
  std::__shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_488,&debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = StackLevelBasedState::Start
                    (&this->super_StackLevelBasedState,(shared_ptr<Debugger> *)&_Stack_488,current);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_488._M_refcount);
  if (bVar1) {
    memset(&local_478,0,0x450);
    (*lua_getstack)(current,0,&local_478);
    (*lua_getinfo)(current,"nSl",&local_478);
    getDebugSource(&local_478);
    std::__cxx11::string::assign((char *)&this->file);
    iVar2 = getDebugCurrentLine(&local_478);
    this->line = iVar2;
    Debugger::ExitDebugMode
              ((debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  return bVar1;
}

Assistant:

bool HookStateStepIn::Start(std::shared_ptr<Debugger> debugger, lua_State* current)
{
	if (!StackLevelBasedState::Start(debugger, current))
		return false;
	lua_Debug ar{};
	lua_getstack(current, 0, &ar);
	lua_getinfo(current, "nSl", &ar);
	file = getDebugSource(&ar);
	line = getDebugCurrentLine(&ar);
	debugger->ExitDebugMode();
	return true;
}